

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O1

clock_t experiment::randomExperiment(uint cashSize)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  iterator __last;
  uint uVar1;
  int iVar2;
  undefined4 *puVar3;
  clock_t cVar4;
  clock_t cVar5;
  size_t __i;
  long lVar6;
  uint uVar7;
  undefined4 uVar8;
  ulong uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2758;
  iterator iStack_2750;
  uint *local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2738;
  random_device local_13b0;
  
  uVar7 = cashSize * 0x100;
  puVar3 = (undefined4 *)operator_new__((ulong)uVar7 * 4);
  local_2758._M_current = (uint *)0x0;
  iStack_2750._M_current = (uint *)0x0;
  local_2748 = (uint *)0x0;
  local_2738._M_x[0] = (ulong)local_2738._M_x[0]._4_4_ << 0x20;
  if (uVar7 != 0) {
    uVar1 = 0;
    do {
      if (iStack_2750._M_current == local_2748) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2758,iStack_2750,
                   (uint *)&local_2738);
      }
      else {
        *iStack_2750._M_current = uVar1;
        iStack_2750._M_current = iStack_2750._M_current + 1;
      }
      uVar1 = (int)local_2738._M_x[0] + 1;
      local_2738._M_x[0] = CONCAT44(local_2738._M_x[0]._4_4_,uVar1);
    } while (uVar1 < uVar7);
  }
  __last._M_current = iStack_2750._M_current;
  __first._M_current = local_2758._M_current;
  std::random_device::random_device(&local_13b0);
  uVar1 = std::random_device::_M_getval();
  local_2738._M_x[0] = (unsigned_long)uVar1;
  lVar6 = 1;
  uVar9 = local_2738._M_x[0];
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar6);
    local_2738._M_x[lVar6] = uVar9;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_2738._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )__last._M_current,&local_2738);
  std::random_device::_M_fini();
  if ((cashSize & 0xffffff) != 0) {
    uVar9 = 0;
    do {
      iVar2 = rand();
      puVar3[uVar9] = iVar2;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  cVar4 = clock();
  uVar8 = 0;
  iVar2 = 1000;
  do {
    if (uVar7 != 0) {
      uVar8 = puVar3[local_2758._M_current[uVar7 - 1]];
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  cVar5 = clock();
  *puVar3 = uVar8;
  operator_delete__(puVar3);
  if (local_2758._M_current != (uint *)0x0) {
    operator_delete(local_2758._M_current,(long)local_2748 - (long)local_2758._M_current);
  }
  return cVar5 - cVar4;
}

Assistant:

clock_t experiment::randomExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    std::vector<unsigned int> index;
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        index.push_back(i);
    }
    std::shuffle(index.begin(), index.end(), std::mt19937(std::random_device()()));
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA = 0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
        for(unsigned int j = 0; j < cashSize * 256; ++j)
        {
            newA = a[index[j]];
        }
    }
    finish = clock();
    a[0]=newA;
    delete []a;
    return finish - start;
}